

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm.hpp
# Opt level: O2

result * baryonyx::itm::optimize(result *__return_storage_ptr__,context *ctx,problem *pb)

{
  bool bVar1;
  
  if ((ctx->parameters).solver != bastert) {
    switch(pb->problem_type) {
    case equalities_01:
      optimize_random_equalities_01(__return_storage_ptr__,ctx,pb);
      return __return_storage_ptr__;
    case equalities_101:
      optimize_random_equalities_101(__return_storage_ptr__,ctx,pb);
      return __return_storage_ptr__;
    case inequalities_01:
      optimize_random_inequalities_01(__return_storage_ptr__,ctx,pb);
      return __return_storage_ptr__;
    case inequalities_101:
      optimize_random_inequalities_101(__return_storage_ptr__,ctx,pb);
      return __return_storage_ptr__;
    }
switchD_0011668d_caseD_2:
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->duration = 0.0;
    __return_storage_ptr__->loop = 0;
    __return_storage_ptr__->variables = 0;
    __return_storage_ptr__->constraints = 0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->strings).
    super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->method)._M_len = 0;
    (__return_storage_ptr__->method)._M_str = (char *)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).names.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    __return_storage_ptr__->remaining_constraints = 0x7fffffff;
    __return_storage_ptr__->annoying_variable = 0;
    __return_storage_ptr__->status = internal_error;
    return __return_storage_ptr__;
  }
  bVar1 = std::operator==(&ctx->method,"buffered");
  if (bVar1) {
switchD_00116709_caseD_0:
    optimize_equalities_01(__return_storage_ptr__,ctx,pb);
  }
  else {
    switch(pb->problem_type) {
    case equalities_01:
      goto switchD_00116709_caseD_0;
    case equalities_101:
      optimize_equalities_101(__return_storage_ptr__,ctx,pb);
      break;
    case equalities_Z:
    case inequalities_Z:
      optimize_inequalities_Z(__return_storage_ptr__,ctx,pb);
      break;
    case inequalities_01:
      optimize_inequalities_01(__return_storage_ptr__,ctx,pb);
      break;
    case inequalities_101:
      optimize_inequalities_101(__return_storage_ptr__,ctx,pb);
      break;
    default:
      goto switchD_0011668d_caseD_2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline result
optimize(const context& ctx, const problem& pb)
{
    if (ctx.parameters.solver == solver_parameters::solver_type::bastert) {
        if (ctx.method == "buffered")
            return optimize_equalities_01(ctx, pb);

        switch (pb.problem_type) {
        case problem_solver_type::equalities_01:
            return optimize_equalities_01(ctx, pb);

        case problem_solver_type::equalities_101:
            return optimize_equalities_101(ctx, pb);

        case problem_solver_type::equalities_Z:
            return optimize_inequalities_Z(ctx, pb);

        case problem_solver_type::inequalities_01:
            return optimize_inequalities_01(ctx, pb);

        case problem_solver_type::inequalities_101:
            return optimize_inequalities_101(ctx, pb);

        case problem_solver_type::inequalities_Z:
            return optimize_inequalities_Z(ctx, pb);
        }
    } else {
        switch (pb.problem_type) {
        case problem_solver_type::equalities_01:
            return optimize_random_equalities_01(ctx, pb);

        case problem_solver_type::equalities_101:
            return optimize_random_equalities_101(ctx, pb);

        case problem_solver_type::equalities_Z:
            return result(result_status::internal_error);

        case problem_solver_type::inequalities_01:
            return optimize_random_inequalities_01(ctx, pb);

        case problem_solver_type::inequalities_101:
            return optimize_random_inequalities_101(ctx, pb);

        case problem_solver_type::inequalities_Z:
            return result(result_status::internal_error);
        }
    }
    return result(result_status::internal_error);
}